

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O1

void ncnn::convolution_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  ulong uVar5;
  undefined4 *puVar6;
  uint _w;
  undefined4 *puVar7;
  int k;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  Mat weight_data_r2;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,weight_data,_w,num_input,num_output,(Allocator *)0x0);
  Mat::create(weight_data_tm,_w,num_input / elempack,num_output / out_elempack,
              (ulong)(uint)elempack * (ulong)(uint)out_elempack * 4,out_elempack * elempack,
              (Allocator *)0x0);
  if (out_elempack <= num_output) {
    pvVar1 = weight_data_tm->data;
    sVar2 = weight_data_tm->cstep;
    sVar3 = weight_data_tm->elemsize;
    uVar5 = 0;
    do {
      if (elempack <= num_input) {
        puVar4 = (undefined4 *)
                 ((long)(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                             / (long)out_elempack) * sVar2 * sVar3 + (long)pvVar1);
        lVar12 = 0;
        do {
          if (0 < (int)_w) {
            lVar10 = 0;
            uVar8 = 0;
            do {
              if (0 < elempack) {
                puVar7 = (undefined4 *)
                         ((lVar12 * local_78.w + uVar5 * local_78.cstep) * local_78.elemsize +
                          lVar10 + (long)local_78.data);
                uVar11 = 0;
                do {
                  puVar6 = puVar7;
                  uVar9 = (ulong)(uint)out_elempack;
                  if (0 < out_elempack) {
                    do {
                      *puVar4 = *puVar6;
                      puVar4 = puVar4 + 1;
                      puVar6 = (undefined4 *)((long)puVar6 + local_78.cstep * local_78.elemsize);
                      uVar9 = uVar9 - 1;
                    } while (uVar9 != 0);
                  }
                  uVar11 = uVar11 + 1;
                  puVar7 = (undefined4 *)((long)puVar7 + (long)local_78.w * local_78.elemsize);
                } while (uVar11 != (uint)elempack);
              }
              uVar8 = uVar8 + 1;
              lVar10 = lVar10 + 4;
            } while (uVar8 != _w);
          }
          lVar12 = lVar12 + elempack;
        } while (lVar12 < (long)num_input - (long)(elempack + -1));
      }
      uVar5 = uVar5 + (long)out_elempack;
    } while ((long)uVar5 < (long)num_output - (long)(out_elempack + -1));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}